

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::LogToSinks
          (log_internal *this,LogEntry *entry,Span<absl::lts_20250127::LogSink_*> extra_sinks,
          bool extra_sinks_only)

{
  Span<absl::lts_20250127::LogSink_*> extra_sinks_00;
  GlobalLogSinkSet *this_00;
  bool extra_sinks_only_local;
  LogEntry *entry_local;
  Span<absl::lts_20250127::LogSink_*> extra_sinks_local;
  
  this_00 = anon_unknown_0::GlobalSinks();
  extra_sinks_00.len_ = (size_type)extra_sinks.ptr_;
  extra_sinks_00.ptr_ = (pointer)entry;
  anon_unknown_0::GlobalLogSinkSet::LogToSinks
            (this_00,(LogEntry *)this,extra_sinks_00,(bool)((byte)extra_sinks.len_ & 1));
  return;
}

Assistant:

void LogToSinks(const absl::LogEntry& entry,
                absl::Span<absl::LogSink*> extra_sinks, bool extra_sinks_only) {
  log_internal::GlobalSinks().LogToSinks(entry, extra_sinks, extra_sinks_only);
}